

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O1

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinB88,void>::
eval_exc_vxc_<int&,double_const*&,double_const*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinB88,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  host_buffer_type eps;
  host_buffer_type vrho;
  host_buffer_type vsigma;
  long lVar1;
  
  N = *args;
  rho = *args_1;
  sigma = *args_2;
  eps = *args_3;
  vrho = *args_4;
  vsigma = *args_5;
  if (*(int *)(this + 8) != 0) {
    if (0 < (int)N) {
      lVar1 = 0;
      do {
        gga_screening_interface<ExchCXX::BuiltinB88>::eval_exc_vxc_unpolar
                  (*(double *)((long)rho + lVar1),*(double *)((long)sigma + lVar1),
                   (double *)((long)eps + lVar1),(double *)((long)vrho + lVar1),
                   (double *)((long)vsigma + lVar1));
        lVar1 = lVar1 + 8;
      } while ((ulong)N << 3 != lVar1);
    }
    return;
  }
  host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinB88>(N,rho,sigma,eps,vrho,vsigma);
  return;
}

Assistant:

void eval_exc_vxc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }